

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_piecewise_linear.c
# Opt level: O0

void fe_warp_piecewise_linear_set_parameters(char *param_str,float sampling_rate)

{
  int iVar1;
  double dVar2;
  int local_12c;
  char local_128 [4];
  int param_index;
  char temp_param_str [256];
  char *seps;
  char *tok;
  float sampling_rate_local;
  char *param_str_local;
  
  temp_param_str._248_8_ = anon_var_dwarf_3b674;
  local_12c = 0;
  nyquist_frequency = sampling_rate / 2.0;
  if (param_str == (char *)0x0) {
    is_neutral = 1;
  }
  else {
    iVar1 = strcmp(param_str,p_str);
    if (iVar1 != 0) {
      is_neutral = 0;
      strcpy(local_128,param_str);
      memset(params,0,8);
      memset(final_piece,0,8);
      strcpy(p_str,param_str);
      seps = strtok(local_128,(char *)temp_param_str._248_8_);
      do {
        if (seps == (char *)0x0) break;
        dVar2 = atof_c(seps);
        iVar1 = local_12c + 1;
        params[local_12c] = (float)dVar2;
        seps = strtok((char *)0x0,(char *)temp_param_str._248_8_);
        local_12c = iVar1;
      } while (iVar1 < 2);
      if (seps != (char *)0x0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_piecewise_linear.c"
                ,0x8e,"Piecewise linear warping takes up to two arguments, %s ignored.\n",seps);
      }
      if (sampling_rate <= params[1]) {
        memset(final_piece,0,8);
      }
      else {
        if ((params[1] == 0.0) && (!NAN(params[1]))) {
          params[1] = sampling_rate * 0.85;
        }
        final_piece[0] =
             (-params[0] * params[1] + nyquist_frequency) / (nyquist_frequency - params[1]);
        final_piece[1] =
             (nyquist_frequency * params[1] * (params[0] - 1.0)) / (nyquist_frequency - params[1]);
      }
      if ((params[0] == 0.0) && (!NAN(params[0]))) {
        is_neutral = 1;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp_piecewise_linear.c"
                ,0xa7,"Piecewise linear warping cannot have slope zero, warping not applied.\n");
      }
    }
  }
  return;
}

Assistant:

void
fe_warp_piecewise_linear_set_parameters(char const *param_str,
                                        float sampling_rate)
{
    char *tok;
    char *seps = " \t";
    char temp_param_str[256];
    int param_index = 0;

    nyquist_frequency = sampling_rate / 2;
    if (param_str == NULL) {
        is_neutral = YES;
        return;
    }
    /* The new parameters are the same as the current ones, so do nothing. */
    if (strcmp(param_str, p_str) == 0) {
        return;
    }
    is_neutral = NO;
    strcpy(temp_param_str, param_str);
    memset(params, 0, N_PARAM * sizeof(float));
    memset(final_piece, 0, 2 * sizeof(float));
    strcpy(p_str, param_str);
    /* FIXME: strtok() is not re-entrant... */
    tok = strtok(temp_param_str, seps);
    while (tok != NULL) {
        params[param_index++] = (float) atof_c(tok);
        tok = strtok(NULL, seps);
        if (param_index >= N_PARAM) {
            break;
        }
    }
    if (tok != NULL) {
        E_INFO
            ("Piecewise linear warping takes up to two arguments, %s ignored.\n",
             tok);
    }
    if (params[1] < sampling_rate) {
        /* Precompute these. These are the coefficients of a
         * straight line that contains the points (F, aF) and (N,
         * N), where a = params[0], F = params[1], N = Nyquist
         * frequency.
         */
        if (params[1] == 0) {
            params[1] = sampling_rate * 0.85f;
        }
        final_piece[0] =
            (nyquist_frequency -
             params[0] * params[1]) / (nyquist_frequency - params[1]);
        final_piece[1] =
            nyquist_frequency * params[1] * (params[0] -
                                         1.0f) / (nyquist_frequency -
                                                  params[1]);
    }
    else {
        memset(final_piece, 0, 2 * sizeof(float));
    }
    if (params[0] == 0) {
        is_neutral = YES;
        E_INFO
            ("Piecewise linear warping cannot have slope zero, warping not applied.\n");
    }
}